

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnpackSnorm::test
          (ShaderBitfieldOperationCaseUnpackSnorm *this,Data *data)

{
  float fVar1;
  GLfloat w;
  GLfloat z;
  GLfloat y;
  GLfloat x;
  Data *data_local;
  ShaderBitfieldOperationCaseUnpackSnorm *this_local;
  
  fVar1 = de::clamp<float>((float)(int)(char)data->inUvec4[0] / 127.0,-1.0,1.0);
  fVar1 = deFloatAbs(data->outVec4[0] - fVar1);
  if (fVar1 <= 0.0001) {
    fVar1 = de::clamp<float>((float)(int)*(char *)((long)data->inUvec4 + 1) / 127.0,-1.0,1.0);
    fVar1 = deFloatAbs(data->outVec4[1] - fVar1);
    if (fVar1 <= 0.0001) {
      fVar1 = de::clamp<float>((float)(int)*(char *)((long)data->inUvec4 + 2) / 127.0,-1.0,1.0);
      fVar1 = deFloatAbs(data->outVec4[2] - fVar1);
      if (fVar1 <= 0.0001) {
        fVar1 = de::clamp<float>((float)(int)*(char *)((long)data->inUvec4 + 3) / 127.0,-1.0,1.0);
        fVar1 = deFloatAbs(data->outVec4[3] - fVar1);
        if (fVar1 <= 0.0001) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool test(Data const* data)
	{
		GLfloat x = float((signed char)((data->inUvec4[0] >> 0) & 0xFF)) / 127.0f;
		x		  = de::clamp<GLfloat>(x, -1.0f, 1.0f);
		if (deFloatAbs(data->outVec4[0] - x) > 0.0001f)
		{
			return false;
		}
		GLfloat y = float((signed char)((data->inUvec4[0] >> 8) & 0xFF)) / 127.0f;
		y		  = de::clamp<GLfloat>(y, -1.0f, 1.0f);
		if (deFloatAbs(data->outVec4[1] - y) > 0.0001f)
		{
			return false;
		}
		GLfloat z = float((signed char)((data->inUvec4[0] >> 16) & 0xFF)) / 127.0f;
		z		  = de::clamp<GLfloat>(z, -1.0f, 1.0f);
		if (deFloatAbs(data->outVec4[2] - z) > 0.0001f)
		{
			return false;
		}
		GLfloat w = float((signed char)((data->inUvec4[0] >> 24) & 0xFF)) / 127.0f;
		w		  = de::clamp<GLfloat>(w, -1.0f, 1.0f);
		if (deFloatAbs(data->outVec4[3] - w) > 0.0001f)
		{
			return false;
		}

		return true;
	}